

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LenInstruction.cpp
# Opt level: O2

int get_ins_len(char f,char s)

{
  int iVar1;
  undefined4 *puVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,f);
  if (iVar1 - 0x20U < 5) {
    if ('B' < s) {
      return 2;
    }
  }
  else if (4 < iVar1 - 0x40U) {
    if (iVar1 - 0x30U < 2) {
      return 2;
    }
    if (iVar1 == -0x20) {
      return 2;
    }
    if (iVar1 != 0x10) {
      if (iVar1 == 0x11) {
        return 2;
      }
      if (iVar1 == 0x25) {
        return 2;
      }
      if (iVar1 == 0x32) {
        if ('B' < s) goto LAB_0010447c;
      }
      else {
        if (iVar1 == 0x70) {
          return 1;
        }
        if (iVar1 != 0x51) {
          if (iVar1 == 0x5f) {
            return 1;
          }
          if ((iVar1 == 0x60) || (iVar1 == 0x61)) goto LAB_0010446e;
          if (iVar1 != 0x50) goto LAB_0010447c;
        }
        if ('D' < s) {
LAB_0010447c:
          puVar2 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar2 = 0xf6;
          __cxa_throw(puVar2,&int::typeinfo,0);
        }
      }
    }
  }
LAB_0010446e:
  iVar1 = _ins_len(s);
  return iVar1 + 2;
}

Assistant:

int get_ins_len(char f, char s) {
	uint8_t f1 = (uint8_t)f;
	switch (f1)
	{
	case INS_MOV: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_LEA: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_INT: {
		//
		return 2;
	}
	case INS_JMP:case INS_JZ:case INS_JNZ:case INS_JH:case INS_JL: {
		return 2 + _ins_len(s);
	}
	case INS_INC:case INS_DEC: {
		return 2;
	}
	case INS_CMP: {
		if (s <= '\x42') return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_ADD: case INS_SUB:case INS_XOR:case INS_AND:case INS_OR: {
		if (s <= '\x42')
		{
			return	2 + _ins_len(s);
		}
	}
	case INS_NOT: {
		return 2;
	}
	case INS_NOP: {
		return 1;
	}
	case INS_PUSH: {
		return 2 + _ins_len(s);
	}
	case INS_POP: {
		return 2;
	}
	case INS_CALL: {
		return 2 + _ins_len(s);
	}
	case INS_RET: {
		return 2 + _ins_len(s);
	}
	case INS_JIT_IN: {
		return 1;
	}
	default: {
		break;
	}

	}
	throw(LVM_EXECUTE_ERROR);
}